

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::addOll(UncoreMinimize *this,Solver *s,LitPair *lits,uint32 size,weight_t w)

{
  bool bVar1;
  uint in_ECX;
  long in_RDX;
  Solver *in_RDI;
  undefined4 in_R8D;
  Literal unaff_retaddr;
  weight_t in_stack_00000014;
  WCTemp *in_stack_00000018;
  Solver *in_stack_00000020;
  Literal fix;
  UncoreMinimize *in_stack_00000028;
  uint32 i;
  weight_t in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint uVar2;
  Solver *s_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  s_00 = in_RDI;
  WCTemp::start((WCTemp *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac);
  for (uVar2 = 0; uVar2 != in_ECX; uVar2 = uVar2 + 1) {
    WCTemp::add((WCTemp *)CONCAT44(in_ECX,in_R8D),
                (Solver *)CONCAT44(uVar2,*(undefined4 *)(in_RDX + (ulong)uVar2 * 8)),
                (Literal)(uint32)((ulong)in_RDX >> 0x20));
  }
  bVar1 = WCTemp::unsat((WCTemp *)in_RDI);
  if (bVar1) {
    bVar1 = bk_lib::
            pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
            ::empty((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     *)&(in_RDI->smallAlloc_).freeList_);
    if (!bVar1) {
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      operator[]((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                  *)&(in_RDI->smallAlloc_).freeList_,0);
    }
    bVar1 = true;
    if (1 < *(int *)&(in_RDI->smallAlloc_).blocks_) {
      bVar1 = fixLit((UncoreMinimize *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                     ,s_00,unaff_retaddr);
    }
  }
  else {
    bVar1 = addOllCon(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
  }
  return bVar1;
}

Assistant:

bool UncoreMinimize::addOll(Solver& s, const LitPair* lits, uint32 size, weight_t w) {
	temp_.start(2);
	for (uint32 i = 0; i != size; ++i) { temp_.add(s, lits[i].lit); }
	if (!temp_.unsat()) {
		return addOllCon(s, temp_, w);
	}
	Literal fix = !temp_.lits.empty() ? temp_.lits[0].first : lits[0].lit;
	return temp_.bound < 2 || fixLit(s, fix);
}